

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

path * __thiscall
irr::io::SNamedPath::PathToName(path *__return_storage_ptr__,SNamedPath *this,path *p)

{
  core::string<char>::string(__return_storage_ptr__,p);
  core::string<char>::replace(__return_storage_ptr__,'\\','/');
  core::string<char>::make_lower(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

path PathToName(const path &p) const
	{
		path name(p);
		name.replace('\\', '/');
		name.make_lower();
		return name;
	}